

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcItem *p)

{
  Table *pTVar1;
  long in_RDX;
  undefined4 in_ESI;
  char *in_RDI;
  int iDb;
  char *zDb;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((*(byte *)(in_RDX + 0x1b) & 1) != 0) {
    sqlite3SchemaToIndex(*(sqlite3 **)in_RDI,*(Schema **)(in_RDX + 0x40));
  }
  pTVar1 = sqlite3LocateTable((Parse *)zDb,iDb,in_RDI,
                              (char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse,
  u32 flags,
  SrcItem *p
){
  const char *zDb;
  if( p->fg.fixedSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->u4.pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    assert( !p->fg.isSubquery );
    zDb = p->u4.zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}